

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O2

void wasm::EffectAnalyzer::InternalAnalyzer::scan(InternalAnalyzer *self,Expression **currp)

{
  Expression *this;
  Try *pTVar1;
  Expression **currp_00;
  ulong index;
  
  this = *currp;
  if (this->_id == TryId) {
    Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
    ::pushTask((Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
                *)self,Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
                       ::doVisitTry,currp);
    Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
    ::pushTask((Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
                *)self,doEndCatch,currp);
    pTVar1 = Expression::cast<wasm::Try>(this);
    index = (ulong)(uint)(pTVar1->catchBodies).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                         usedElements;
    while (0 < (int)index) {
      index = index - 1;
      currp_00 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar1->catchBodies).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,index);
      Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
      ::pushTask((Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
                  *)self,scan,currp_00);
    }
    Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
    ::pushTask((Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
                *)self,doStartCatch,currp);
    pTVar1 = Expression::cast<wasm::Try>(this);
    Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
    ::pushTask((Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
                *)self,scan,&pTVar1->body);
    Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
    ::pushTask((Walker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
                *)self,doStartTry,currp);
    return;
  }
  PostWalker<wasm::EffectAnalyzer::InternalAnalyzer,_wasm::OverriddenVisitor<wasm::EffectAnalyzer::InternalAnalyzer,_void>_>
  ::scan(self,currp);
  return;
}

Assistant:

static void scan(InternalAnalyzer* self, Expression** currp) {
      Expression* curr = *currp;
      // We need to decrement try depth before catch starts, so handle it
      // separately
      if (curr->is<Try>()) {
        self->pushTask(doVisitTry, currp);
        self->pushTask(doEndCatch, currp);
        auto& catchBodies = curr->cast<Try>()->catchBodies;
        for (int i = int(catchBodies.size()) - 1; i >= 0; i--) {
          self->pushTask(scan, &catchBodies[i]);
        }
        self->pushTask(doStartCatch, currp);
        self->pushTask(scan, &curr->cast<Try>()->body);
        self->pushTask(doStartTry, currp);
        return;
      }
      PostWalker<InternalAnalyzer, OverriddenVisitor<InternalAnalyzer>>::scan(
        self, currp);
    }